

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall unitOps_rootPow1_Test::unitOps_rootPow1_Test(unitOps_rootPow1_Test *this)

{
  unitOps_rootPow1_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__unitOps_rootPow1_Test_0025be48;
  return;
}

Assistant:

TEST(unitOps, rootPow1)
{
    EXPECT_EQ(root(count, 1), count);
    EXPECT_EQ(root(cd, 1), cd);
    EXPECT_EQ(root(mol, 1), mol);
    EXPECT_EQ(root(currency, 1), currency);

    EXPECT_EQ(root(count, -1), count.inv());
    EXPECT_EQ(root(cd, -1), cd.inv());
    EXPECT_EQ(root(mol, -1), mol.inv());
    EXPECT_EQ(root(currency, -1), currency.inv());
}